

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O1

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  ulong uVar4;
  BackwardMatch BVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_4_3_cc401a1e_for_u *paVar9;
  ulong uVar10;
  byte bVar11;
  float fVar12;
  uint uVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  uint uVar18;
  long lVar19;
  size_t *psVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong uVar24;
  long lVar25;
  ulong *puVar26;
  ulong *puVar27;
  size_t sVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  ulong local_f0;
  ushort local_dc;
  
  uVar1 = pos + block_start;
  sVar14 = max_backward_limit;
  if (uVar1 < max_backward_limit) {
    sVar14 = uVar1;
  }
  uVar7 = uVar1 + params->stream_offset;
  if (max_backward_limit <= uVar7) {
    uVar7 = max_backward_limit;
  }
  iVar3 = params->quality;
  uVar15 = 0x96;
  if (10 < iVar3) {
    uVar15 = 0x145;
  }
  sVar28 = (params->dictionary).compound.total_size;
  EvaluateNode(params->stream_offset + block_start,pos,max_backward_limit,sVar28,starting_dist_cache
               ,model,queue,nodes);
  uVar8 = 2;
  if (pos + 2 <= num_bytes) {
    uVar8 = (ulong)((-(int)queue->idx_ & 7U) << 5);
    fVar40 = (model->literal_costs_[pos] -
             model->literal_costs_[*(long *)((long)queue->q_[0].distance_cache + (uVar8 - 8))]) +
             *(float *)((long)queue->q_[0].distance_cache + uVar8 + 0x14) + model->min_cost_cmd_;
    paVar9 = &nodes[pos + 2].u;
    lVar19 = 4;
    uVar21 = 10;
    uVar24 = 2;
    do {
      uVar8 = uVar24;
      if (fVar40 < paVar9->cost) break;
      uVar8 = uVar24 + 1;
      bVar38 = uVar8 == uVar21;
      fVar12 = fVar40 + 1.0;
      if (!bVar38) {
        fVar12 = fVar40;
      }
      fVar40 = fVar12;
      lVar25 = 0;
      if (bVar38) {
        lVar25 = lVar19;
      }
      lVar19 = lVar19 << bVar38;
      uVar21 = uVar21 + lVar25;
      paVar9 = paVar9 + 4;
      lVar25 = pos + uVar24;
      uVar24 = uVar8;
    } while (lVar25 + 1U <= num_bytes);
  }
  uVar24 = num_bytes - pos;
  uVar10 = sVar28 + uVar7;
  local_f0 = 0;
  uVar21 = 0;
  do {
    uVar29 = queue->idx_;
    uVar33 = 8;
    if (uVar29 < 8) {
      uVar33 = uVar29;
    }
    if (uVar33 <= uVar21) {
      return local_f0;
    }
    uVar29 = (ulong)(((int)uVar21 - (int)uVar29 & 7U) << 5);
    uVar33 = pos - *(long *)((long)queue->q_[0].distance_cache + (uVar29 - 8));
    fVar40 = (float)uVar33;
    fVar12 = fVar40;
    if (5 < uVar33) {
      if (uVar33 < 0x82) {
        uVar18 = 0x1f;
        uVar13 = (uint)(uVar33 - 2);
        if (uVar13 != 0) {
          for (; uVar13 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        fVar12 = (float)((int)(uVar33 - 2 >> ((char)(uVar18 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar18 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar33 < 0x842) {
        uVar18 = 0x1f;
        if ((int)fVar40 - 0x42U != 0) {
          for (; (int)fVar40 - 0x42U >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        fVar12 = (float)((uVar18 ^ 0xffe0) + 0x2a);
      }
      else {
        fVar12 = 2.94273e-44;
        if (0x1841 < uVar33) {
          fVar12 = (float)(uint)(ushort)(0x17 - (uVar33 < 0x5842));
        }
      }
    }
    uVar18 = (uint)fVar12 & 0xffff;
    fVar39 = (model->literal_costs_[pos] - *model->literal_costs_) +
             (float)*(uint *)(duckdb_brotli::kBrotliInsExtra + (ulong)uVar18 * 4) +
             *(float *)((long)queue->q_[0].distance_cache + uVar29 + 0x10);
    if (uVar8 - 1 < uVar24) {
      uVar34 = 0;
      uVar33 = uVar8 - 1;
      sVar28 = pos;
      do {
        uVar35 = uVar33 + (uVar1 & ringbuffer_mask);
        if ((uVar35 <= ringbuffer_mask) &&
           (uVar37 = (long)kDistanceCacheOffset[uVar34] +
                     (long)*(int *)((long)queue->q_[0].distance_cache +
                                   (ulong)kDistanceCacheIndex[uVar34] * 4 + uVar29),
           uVar37 <= uVar10)) {
          if (sVar14 < uVar37) {
            if (uVar7 < uVar37) {
              uVar16 = (params->dictionary).compound.total_size + uVar7;
              psVar20 = (params->dictionary).compound.chunk_offsets;
              do {
                psVar20 = psVar20 + 1;
              } while (*psVar20 + uVar37 <= uVar16);
              uVar22 = *psVar20 + (uVar37 - uVar16);
              if (uVar24 <= uVar22) {
                uVar22 = uVar24;
              }
              if ((uVar33 < uVar22) &&
                 (puVar17 = (ulong *)((uint8_t *)psVar20[-0x11] + (uVar16 - (psVar20[-1] + uVar37)))
                 , puVar26 = (ulong *)(ringbuffer + (uVar1 & ringbuffer_mask)), puVar23 = puVar17,
                 ringbuffer[uVar35] == *(uint8_t *)(uVar33 + (long)puVar17))) {
                for (; 7 < uVar22; uVar22 = uVar22 - 8) {
                  uVar16 = *puVar26;
                  uVar4 = *puVar23;
                  if (uVar16 == uVar4) {
                    puVar23 = puVar23 + 1;
                  }
                  else {
                    uVar6 = 0;
                    if ((uVar4 ^ uVar16) != 0) {
                      for (; ((uVar4 ^ uVar16) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                      }
                    }
                    sVar28 = (long)puVar23 + ((uVar6 >> 3 & 0x1fffffff) - (long)puVar17);
                  }
                  if (uVar16 != uVar4) {
                    bVar38 = true;
                    goto LAB_01c42a05;
                  }
                  puVar26 = puVar26 + 1;
                }
                puVar27 = puVar23;
                if (uVar22 != 0) {
                  puVar27 = (ulong *)((long)puVar23 + uVar22);
                  uVar16 = 0;
                  do {
                    if (*(char *)((long)puVar23 + uVar16) != *(char *)((long)puVar26 + uVar16)) {
                      puVar27 = (ulong *)((long)puVar23 + uVar16);
                      break;
                    }
                    uVar16 = uVar16 + 1;
                  } while (uVar22 != uVar16);
                }
                sVar28 = (long)puVar27 - (long)puVar17;
                bVar38 = true;
              }
              else {
                bVar38 = false;
                sVar28 = 0;
              }
LAB_01c42a05:
              if (bVar38) {
LAB_01c42a50:
                if (uVar33 + 1 <= sVar28) {
                  fVar2 = model->cost_dist_[uVar34];
                  local_dc = SUB42(fVar12,0);
                  paVar9 = &nodes[pos + uVar33 + 1].u;
                  uVar16 = uVar33;
                  do {
                    uVar33 = uVar16 + 1;
                    iVar31 = (int)uVar16;
                    if (uVar33 < 10) {
                      uVar13 = iVar31 - 1;
                    }
                    else if (uVar33 < 0x86) {
                      uVar13 = 0x1f;
                      uVar30 = (uint)(uVar16 - 5);
                      if (uVar30 != 0) {
                        for (; uVar30 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                        }
                      }
                      uVar13 = (int)(uVar16 - 5 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                               (uVar13 ^ 0xffffffe0) * 2 + 0x42;
                    }
                    else {
                      uVar13 = 0x17;
                      if (uVar33 < 0x846) {
                        uVar13 = 0x1f;
                        if (iVar31 - 0x45U != 0) {
                          for (; iVar31 - 0x45U >> uVar13 == 0; uVar13 = uVar13 - 1) {
                          }
                        }
                        uVar13 = (uVar13 ^ 0xffe0) + 0x2c;
                      }
                    }
                    uVar30 = uVar13 & 7 | uVar18 * 8 & 0x38;
                    if ((ushort)uVar13 < 0x10 && (uVar34 == 0 && local_dc < 8)) {
                      if (7 < (ushort)uVar13) {
                        uVar30 = uVar30 + 0x40;
                      }
                    }
                    else {
                      iVar32 = ((uVar13 & 0xffff) >> 3) + (uVar18 >> 3) * 3;
                      uVar30 = uVar30 + (0x520d40U >> ((char)iVar32 * '\x02' & 0x1fU) & 0xc0) +
                                        iVar32 * 0x40 + 0x40;
                    }
                    fVar41 = fVar39;
                    if (0x7f < (uint)((ulong)uVar30 & 0xffff)) {
                      fVar41 = fVar2 + fVar39;
                    }
                    fVar41 = (float)*(uint *)(duckdb_brotli::kBrotliCopyExtra +
                                             (ulong)(uVar13 & 0xffff) * 4) + fVar41 +
                             model->cost_cmd_[(ulong)uVar30 & 0xffff];
                    if (fVar41 < paVar9->cost) {
                      ((ZopfliNode *)(paVar9 + -3))->length = iVar31 + 1U | 0x12000000;
                      paVar9[-2].next = (uint32_t)(float)uVar37;
                      paVar9[-1].next = (uint)fVar40 | (int)uVar34 * 0x8000000 + 0x8000000U;
                      paVar9->cost = fVar41;
                      if (local_f0 <= uVar33) {
                        local_f0 = uVar33;
                      }
                    }
                    uVar22 = uVar16 + 2;
                    paVar9 = paVar9 + 4;
                    uVar16 = uVar33;
                  } while (uVar22 <= sVar28);
                }
              }
            }
          }
          else if (uVar1 - uVar37 < uVar1) {
            uVar22 = uVar1 - uVar37 & ringbuffer_mask;
            uVar16 = uVar22 + uVar33;
            if ((uVar16 <= ringbuffer_mask) && (ringbuffer[uVar35] == ringbuffer[uVar16])) {
              puVar17 = (ulong *)(ringbuffer + uVar22);
              puVar26 = (ulong *)(ringbuffer + (uVar1 & ringbuffer_mask));
              puVar23 = puVar17;
              for (uVar16 = uVar24; 7 < uVar16; uVar16 = uVar16 - 8) {
                uVar22 = *puVar26;
                uVar4 = *puVar23;
                if (uVar22 == uVar4) {
                  puVar23 = puVar23 + 1;
                }
                else {
                  uVar6 = 0;
                  if ((uVar4 ^ uVar22) != 0) {
                    for (; ((uVar4 ^ uVar22) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                    }
                  }
                  sVar28 = (long)puVar23 + ((uVar6 >> 3 & 0x1fffffff) - (long)puVar17);
                }
                if (uVar22 != uVar4) goto LAB_01c42a50;
                puVar26 = puVar26 + 1;
              }
              puVar27 = puVar23;
              if (uVar16 != 0) {
                puVar27 = (ulong *)((long)puVar23 + uVar16);
                uVar22 = 0;
                do {
                  if (*(char *)((long)puVar23 + uVar22) != *(char *)((long)puVar26 + uVar22)) {
                    puVar27 = (ulong *)((long)puVar23 + uVar22);
                    break;
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar16 != uVar22);
              }
              sVar28 = (long)puVar27 - (long)puVar17;
              goto LAB_01c42a50;
            }
          }
        }
      } while (((uVar35 <= ringbuffer_mask) && (uVar34 < 0xf)) &&
              (uVar34 = uVar34 + 1, uVar33 < uVar24));
    }
    if (uVar21 < 2 && num_matches != 0) {
      sVar28 = 0;
      uVar29 = uVar8;
      do {
        BVar5 = matches[sVar28];
        uVar37 = (ulong)BVar5 & 0xffffffff;
        uVar33 = uVar37 + 0xf;
        uVar35 = (ulong)(params->dist).num_direct_distance_codes;
        uVar34 = uVar35 + 0x10;
        if (uVar34 <= uVar33) {
          uVar13 = (params->dist).distance_postfix_bits;
          bVar11 = (byte)uVar13;
          uVar33 = ~uVar35 + uVar37 + (4L << (bVar11 & 0x3f));
          uVar30 = 0x1f;
          uVar36 = (uint)uVar33;
          if (uVar36 != 0) {
            for (; uVar36 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          uVar35 = (ulong)((uVar30 ^ 0xffffffe0) + 0x1f);
          lVar19 = uVar35 - uVar13;
          uVar33 = (~(-1 << (bVar11 & 0x1f)) & uVar36) + uVar34 +
                   (lVar19 * 2 + -2 + (ulong)((uVar33 >> (uVar35 & 0x3f) & 1) != 0) <<
                   (bVar11 & 0x3f)) | lVar19 * 0x400;
        }
        uVar35 = (ulong)BVar5 >> 0x25;
        uVar34 = uVar35;
        if (uVar35 < uVar29) {
          uVar34 = uVar29;
        }
        if (uVar15 < uVar35) {
          uVar29 = uVar34;
        }
        if (uVar10 < uVar37) {
          uVar29 = uVar34;
        }
        if (uVar29 <= uVar35) {
          fVar2 = model->cost_dist_[(uint)uVar33 & 0x3ff];
          uVar34 = (ulong)(BVar5.length_and_code & 0x1f);
          if (((ulong)BVar5 & 0x1f00000000) == 0) {
            uVar34 = uVar35;
          }
          paVar9 = &nodes[pos + uVar29].u;
          lVar19 = uVar29 * 0x2000000 + 0x12000000;
          do {
            uVar16 = uVar29;
            if (uVar10 < uVar37) {
              uVar16 = uVar34;
            }
            iVar31 = (int)uVar16;
            if (uVar16 < 10) {
              uVar13 = iVar31 - 2;
            }
            else if (uVar16 < 0x86) {
              uVar13 = 0x1f;
              uVar30 = (uint)(uVar16 - 6);
              if (uVar30 != 0) {
                for (; uVar30 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              uVar13 = (int)(uVar16 - 6 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar13 ^ 0xffffffe0) * 2 + 0x42;
            }
            else {
              uVar13 = 0x17;
              if (uVar16 < 0x846) {
                uVar13 = 0x1f;
                if (iVar31 - 0x46U != 0) {
                  for (; iVar31 - 0x46U >> uVar13 == 0; uVar13 = uVar13 - 1) {
                  }
                }
                uVar13 = (uVar13 ^ 0xffe0) + 0x2c;
              }
            }
            iVar32 = ((uVar13 & 0xffff) >> 3) + (uVar18 >> 3) * 3;
            fVar41 = (float)*(uint *)(duckdb_brotli::kBrotliCopyExtra + (ulong)(uVar13 & 0xffff) * 4
                                     ) + (float)((uint)(uVar33 >> 10) & 0x3f) + fVar39 + fVar2 +
                     model->cost_cmd_
                     [(0x520d40U >> ((char)iVar32 * '\x02' & 0x1fU) & 0xc0) + iVar32 * 0x40 +
                      (uVar13 & 7 | ((uint)fVar12 & 7) << 3) + 0x40 & 0xffff];
            if (fVar41 < paVar9->cost) {
              ((ZopfliNode *)(paVar9 + -3))->length =
                   (uint)uVar29 | (int)lVar19 + iVar31 * -0x2000000;
              paVar9[-2].next = BVar5.distance;
              paVar9[-1].next = (uint32_t)fVar40;
              paVar9->cost = fVar41;
              if (local_f0 <= uVar29) {
                local_f0 = uVar29;
              }
            }
            uVar29 = uVar29 + 1;
            paVar9 = paVar9 + 4;
            lVar19 = lVar19 + 0x2000000;
          } while (uVar35 + 1 != uVar29);
        }
        sVar28 = sVar28 + 1;
      } while (sVar28 != num_matches);
    }
    if (iVar3 < 0xb) {
      return local_f0;
    }
    bVar38 = 3 < uVar21;
    uVar21 = uVar21 + 1;
    if (bVar38) {
      return local_f0;
    }
  } while( true );
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t dictionary_start = BROTLI_MIN(size_t,
      cur_ix + stream_offset, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;

  EvaluateNode(block_start + stream_offset, pos, max_backward_limit, gap,
      starting_dist_cache, model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > dictionary_start + gap)) {
        /* Word dictionary -> ignore. */
        continue;
      }
      if (backward <= max_distance) {
        /* Regular backward reference. */
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else if (backward > dictionary_start) {
        size_t d = 0;
        size_t offset;
        size_t limit;
        const uint8_t* source;
        offset = dictionary_start + 1 + addon->total_size - 1;
        while (offset >= backward + addon->chunk_offsets[d + 1]) d++;
        source = addon->chunk_source[d];
        offset = offset - addon->chunk_offsets[d] - backward;
        limit = addon->chunk_offsets[d + 1] - addon->chunk_offsets[d] - offset;
        limit = limit > max_len ? max_len : limit;
        if (best_len >= limit ||
            continuation != source[offset + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&source[offset],
                                       &ringbuffer[cur_ix_masked],
                                       limit);
      } else {
        /* "Gray" area. It is addressable by decoder, but this encoder
           instance does not have that data -> should not touch it. */
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > dictionary_start + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}